

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)202>(Result *__return_storage_ptr__,Model *pipeline)

{
  Pipeline *pipelineParams;
  
  if (pipeline->_oneof_case_[0] == 0xca) {
    pipelineParams = (pipeline->Type_).pipeline_;
  }
  else {
    pipelineParams = Specification::Pipeline::default_instance();
  }
  validate(__return_storage_ptr__,pipeline,pipelineParams);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipeline>(const Specification::Model& pipeline) {
        return validate(pipeline, pipeline.pipeline());
    }